

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  ushort uVar3;
  StructDataBitCount SVar4;
  CapTableReader *pCVar5;
  word *pwVar6;
  Arena *pAVar7;
  ReadLimiter *pRVar8;
  ulong uVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  SegmentBuilder **ppSVar13;
  uint uVar14;
  SegmentBuilder *pSVar15;
  ulong uVar16;
  ElementSize EVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  Fault f;
  Fault local_28;
  SegmentBuilder *pSVar11;
  
  uVar14 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar14 == 0) goto LAB_003de492;
  pSVar11 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  ppSVar13 = (SegmentBuilder **)this->location;
  if (pSVar11 == (SegmentBuilder *)0x0) {
    pSVar11 = (SegmentBuilder *)0x0;
LAB_003de2d0:
    if (ppSVar13 == (SegmentBuilder **)0x0) goto LAB_003de492;
LAB_003de2dc:
    uVar14 = (uint)(this->tag).content;
  }
  else {
    if ((uVar14 & 3) != 2) goto LAB_003de2d0;
    iVar10 = (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[2])();
    pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    if (pSVar11 == (SegmentBuilder *)0x0) {
      asListReaderAnySize();
      goto LAB_003de492;
    }
    uVar16 = (pSVar11->super_SegmentReader).ptr.size_;
    uVar14 = (uint)(this->tag).content;
    uVar12 = (ulong)(uVar14 >> 3);
    if ((long)uVar16 < (long)(ulong)(uVar14 >> 3)) {
      uVar12 = uVar16;
    }
    uVar20 = 2 - (ulong)((uVar14 & 4) == 0);
    if (uVar16 < uVar12 + uVar20) {
LAB_003de50d:
      asListReaderAnySize();
      goto LAB_003de492;
    }
    pwVar6 = (pSVar11->super_SegmentReader).ptr.ptr;
    pAVar7 = (pSVar11->super_SegmentReader).arena;
    pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
    uVar9 = pRVar8->limit;
    if (uVar9 < uVar20) {
      (*pAVar7->_vptr_Arena[3])();
      goto LAB_003de50d;
    }
    this = (OrphanBuilder *)(pwVar6 + uVar12);
    ppSVar1 = &this->segment;
    pRVar8->limit = uVar9 - uVar20;
    if ((uVar14 & 4) != 0) {
      iVar10 = (*pAVar7->_vptr_Arena[2])(pAVar7,(ulong)*(uint *)((long)&(this->tag).content + 4));
      pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar10);
      if (pSVar11 == (SegmentBuilder *)0x0) {
        asListReaderAnySize();
        goto LAB_003de492;
      }
      uVar14 = (uint)(this->tag).content;
      if ((uVar14 & 3) != 2) {
        asListReaderAnySize();
        goto LAB_003de492;
      }
      uVar12 = (ulong)(uVar14 >> 3);
      uVar16 = (pSVar11->super_SegmentReader).ptr.size_;
      if ((long)uVar16 < (long)uVar12) {
        uVar12 = uVar16;
      }
      ppSVar13 = (SegmentBuilder **)((pSVar11->super_SegmentReader).ptr.ptr + uVar12);
      this = (OrphanBuilder *)ppSVar1;
      goto LAB_003de2d0;
    }
    uVar14 = (uint)(this->tag).content;
    lVar19 = (long)((int)uVar14 >> 2);
    ppSVar13 = (SegmentBuilder **)(pwVar6 + uVar16);
    if ((lVar19 < (long)pwVar6 - (long)ppSVar1 >> 3) ||
       ((long)ppSVar13 - (long)ppSVar1 >> 3 < lVar19)) goto LAB_003de2dc;
    ppSVar13 = ppSVar1 + lVar19;
  }
  if ((uVar14 & 3) != 1) {
    asListReaderAnySize();
    goto LAB_003de492;
  }
  uVar14 = *(uint *)((long)&(this->tag).content + 4);
  EVar17 = (ElementSize)uVar14 & INLINE_COMPOSITE;
  if (EVar17 != INLINE_COMPOSITE) {
    SVar4 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar14 & 7) * 4);
    uVar16 = (ulong)(uVar14 >> 3);
    uVar18 = (uint)(EVar17 == POINTER) * 0x40 + SVar4;
    if (pSVar11 == (SegmentBuilder *)0x0) {
      if (EVar17 == BIT) {
LAB_003de45a:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x945,FAILED,(char *)0x0,
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault(&local_28);
        goto LAB_003de492;
      }
LAB_003de4ad:
      __return_storage_ptr__->segment = &pSVar11->super_SegmentReader;
      __return_storage_ptr__->capTable = pCVar5;
      __return_storage_ptr__->ptr = (byte *)ppSVar13;
      __return_storage_ptr__->elementCount = uVar14 >> 3;
      __return_storage_ptr__->step = uVar18;
      __return_storage_ptr__->structDataSize = SVar4;
      __return_storage_ptr__->structPointerCount = (ushort)(EVar17 == POINTER);
      __return_storage_ptr__->elementSize = EVar17;
      goto LAB_003de4d5;
    }
    uVar12 = uVar18 * uVar16 + 0x3f >> 6 & 0xffffffff;
    if (((long)ppSVar13 - (long)(pSVar11->super_SegmentReader).ptr.ptr >> 3) + uVar12 <=
        (pSVar11->super_SegmentReader).ptr.size_) {
      pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
      if (uVar12 <= pRVar8->limit) {
        pRVar8->limit = pRVar8->limit - uVar12;
        if (EVar17 == BIT) goto LAB_003de45a;
        if ((int)((ulong)uVar14 & 7) == 0) {
          if (pRVar8->limit < uVar16) {
            asListReaderAnySize();
            goto LAB_003de492;
          }
          pRVar8->limit = pRVar8->limit - uVar16;
        }
        goto LAB_003de4ad;
      }
      (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
    }
    asListReaderAnySize();
    goto LAB_003de492;
  }
  uVar14 = uVar14 >> 3;
  if (pSVar11 == (SegmentBuilder *)0x0) {
LAB_003de33e:
    if ((*(uint *)ppSVar13 & 3) == 0) {
      uVar18 = *(uint *)ppSVar13 >> 2 & 0x1fffffff;
      uVar16 = (ulong)uVar18;
      uVar2 = *(ushort *)((long)ppSVar13 + 4);
      uVar3 = *(ushort *)((long)ppSVar13 + 6);
      uVar21 = (uint)uVar3 + (uint)uVar2;
      if (uVar21 * uVar16 < (ulong)uVar14 || uVar21 * uVar16 - (ulong)uVar14 == 0) {
        pSVar15 = (SegmentBuilder *)0x0;
        if (uVar21 != 0) {
          pSVar15 = pSVar11;
        }
        if ((pSVar11 != (SegmentBuilder *)0x0) && (uVar21 == 0)) {
          pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
          uVar12 = pRVar8->limit;
          if (uVar12 < uVar16) {
            asListReaderAnySize();
            goto LAB_003de492;
          }
          pRVar8->limit = uVar12 - uVar16;
          pSVar15 = pSVar11;
        }
        __return_storage_ptr__->segment = &pSVar15->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar5;
        __return_storage_ptr__->ptr = (byte *)(ppSVar13 + 1);
        __return_storage_ptr__->elementCount = uVar18;
        __return_storage_ptr__->step = uVar21 * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->structPointerCount = uVar3;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_003de4d5:
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        return __return_storage_ptr__;
      }
      asListReaderAnySize();
    }
    else {
      asListReaderAnySize();
    }
  }
  else {
    if (((long)ppSVar13 - (long)(pSVar11->super_SegmentReader).ptr.ptr >> 3) + (ulong)uVar14 + 1 <=
        (pSVar11->super_SegmentReader).ptr.size_) {
      uVar16 = (ulong)uVar14 + 1;
      pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
      uVar12 = pRVar8->limit;
      if (uVar16 <= uVar12) {
        pRVar8->limit = uVar12 - uVar16;
        goto LAB_003de33e;
      }
      (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
    }
    asListReaderAnySize();
  }
LAB_003de492:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}